

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandReadLib(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FILE *pFVar5;
  SC_Lib *pLib_00;
  char *pcVar6;
  float fVar7;
  double dVar8;
  uint local_60;
  uint local_5c;
  int fVeryVerbose;
  int fVerbose;
  int fShortNames;
  int nGatesMin;
  float Gain;
  float Slew;
  int fDump;
  int c;
  SC_Lib *pLib;
  FILE *pFile;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar2 = false;
  nGatesMin = 0;
  fShortNames = 0;
  fVerbose = 0;
  bVar1 = false;
  local_5c = 1;
  local_60 = 0;
  Extra_UtilGetoptReset();
LAB_004b60fd:
  iVar3 = Extra_UtilGetopt(argc,argv,"SGMdnvwh");
  if (iVar3 == -1) {
    if (argc == globalUtilOptind + 1) {
      pcVar6 = argv[globalUtilOptind];
      pFVar5 = fopen(pcVar6,"rb");
      if (pFVar5 == (FILE *)0x0) {
        fprintf((FILE *)pAbc->Err,"Cannot open input file \"%s\". \n",pcVar6);
        return 1;
      }
      fclose(pFVar5);
      pLib_00 = Abc_SclReadLiberty(pcVar6,local_5c,local_60);
      if (pLib_00 == (SC_Lib *)0x0) {
        fprintf((FILE *)pAbc->Err,"Reading SCL library from file \"%s\" has failed. \n",pcVar6);
        return 1;
      }
      iVar3 = Abc_SclLibClassNum(pLib_00);
      if (iVar3 < 3) {
        pFVar5 = (FILE *)pAbc->Err;
        uVar4 = Abc_SclLibClassNum(pLib_00);
        fprintf(pFVar5,"Library with only %d cell classes cannot be used.\n",(ulong)uVar4);
        Abc_SclLibFree(pLib_00);
        return 0;
      }
      Abc_SclLoad(pLib_00,(SC_Lib **)&pAbc->pLibScl);
      if (bVar1) {
        Abc_SclShortNames(pLib_00);
      }
      if ((bVar2) && (pAbc->pLibScl != (void *)0x0)) {
        pcVar6 = Extra_FileNameGenericAppend(pcVar6,"_temp.lib");
        Abc_SclWriteLiberty(pcVar6,(SC_Lib *)pAbc->pLibScl);
      }
      if (pAbc->pLibScl != (void *)0x0) {
        Abc_SclInstallGenlib(pAbc->pLibScl,(float)nGatesMin,(float)fShortNames,fVerbose);
        Mio_LibraryTransferCellIds();
      }
      return 0;
    }
    goto LAB_004b646b;
  }
  switch(iVar3) {
  case 0x47:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-G\" should be followed by a floating point number.\n");
      goto LAB_004b646b;
    }
    dVar8 = atof(argv[globalUtilOptind]);
    fShortNames = (int)(float)dVar8;
    fVar7 = (float)fShortNames;
    break;
  default:
    goto LAB_004b646b;
  case 0x4d:
    if (globalUtilOptind < argc) goto LAB_004b6259;
    Abc_Print(-1,"Command line switch \"-M\" should be followed by a positive integer.\n");
    goto LAB_004b646b;
  case 0x53:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-S\" should be followed by a floating point number.\n");
      goto LAB_004b646b;
    }
    dVar8 = atof(argv[globalUtilOptind]);
    nGatesMin = (int)(float)dVar8;
    fVar7 = (float)nGatesMin;
    break;
  case 100:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_004b60fd;
  case 0x68:
    goto LAB_004b646b;
  case 0x6e:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_004b60fd;
  case 0x76:
    local_5c = local_5c ^ 1;
    goto LAB_004b60fd;
  case 0x77:
    local_60 = local_60 ^ 1;
    goto LAB_004b60fd;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (fVar7 <= 0.0) goto LAB_004b646b;
  goto LAB_004b60fd;
LAB_004b6259:
  fVerbose = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if (fVerbose < 0) {
LAB_004b646b:
    fprintf((FILE *)pAbc->Err,"usage: read_lib [-SG float] [-M num] [-dnvwh] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t           reads Liberty library from file\n");
    fprintf((FILE *)pAbc->Err,
            "\t-S float : the slew parameter used to generate the library [default = %.2f]\n",
            (double)(float)nGatesMin);
    fprintf((FILE *)pAbc->Err,
            "\t-G float : the gain parameter used to generate the library [default = %.2f]\n",
            (double)(float)fShortNames);
    fprintf((FILE *)pAbc->Err,
            "\t-M num   : skip gate classes whose size is less than this [default = %d]\n",
            (ulong)(uint)fVerbose);
    pcVar6 = "no";
    if (bVar2) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-d       : toggle dumping the parsed library into file \"*_temp.lib\" [default = %s]\n"
            ,pcVar6);
    pcVar6 = "no";
    if (bVar1) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-n       : toggle replacing gate/pin names by short strings [default = %s]\n",pcVar6)
    ;
    pcVar6 = "no";
    if (local_5c != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-v       : toggle writing verbose information [default = %s]\n",
            pcVar6);
    pcVar6 = "no";
    if (local_60 != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-v       : toggle writing information about skipped gates [default = %s]\n",pcVar6);
    fprintf((FILE *)pAbc->Err,"\t-h       : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,"\t<file>   : the name of a file to read\n");
    return 1;
  }
  goto LAB_004b60fd;
}

Assistant:

int Scl_CommandReadLib( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileName;
    FILE * pFile;
    SC_Lib * pLib;
    int c, fDump = 0;
    float Slew = 0;
    float Gain = 0;
    int nGatesMin = 0;
    int fShortNames = 0;
    int fVerbose = 1;
    int fVeryVerbose = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SGMdnvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Slew = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Slew <= 0.0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Gain = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Gain <= 0.0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nGatesMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nGatesMin < 0 ) 
                goto usage;
            break;
        case 'd':
            fDump ^= 1;
            break;
        case 'n':
            fShortNames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open input file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );
    // read new library
    pLib = Abc_SclReadLiberty( pFileName, fVerbose, fVeryVerbose );
    if ( pLib == NULL )
    {
        fprintf( pAbc->Err, "Reading SCL library from file \"%s\" has failed. \n", pFileName );
        return 1;
    }
    if ( Abc_SclLibClassNum(pLib) < 3 )
    {
        fprintf( pAbc->Err, "Library with only %d cell classes cannot be used.\n", Abc_SclLibClassNum(pLib) );
        Abc_SclLibFree(pLib);
        return 0;
    }
    Abc_SclLoad( pLib, (SC_Lib **)&pAbc->pLibScl );
    // convert the library if needed
    if ( fShortNames )
        Abc_SclShortNames( pLib );
    // dump the resulting library
    if ( fDump && pAbc->pLibScl )
        Abc_SclWriteLiberty( Extra_FileNameGenericAppend(pFileName, "_temp.lib"), (SC_Lib *)pAbc->pLibScl );
    // extract genlib library
    if ( pAbc->pLibScl )
    {
        Abc_SclInstallGenlib( pAbc->pLibScl, Slew, Gain, nGatesMin );
        Mio_LibraryTransferCellIds();
    }
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_lib [-SG float] [-M num] [-dnvwh] <file>\n" );
    fprintf( pAbc->Err, "\t           reads Liberty library from file\n" );
    fprintf( pAbc->Err, "\t-S float : the slew parameter used to generate the library [default = %.2f]\n", Slew );
    fprintf( pAbc->Err, "\t-G float : the gain parameter used to generate the library [default = %.2f]\n", Gain );
    fprintf( pAbc->Err, "\t-M num   : skip gate classes whose size is less than this [default = %d]\n", nGatesMin );
    fprintf( pAbc->Err, "\t-d       : toggle dumping the parsed library into file \"*_temp.lib\" [default = %s]\n", fDump? "yes": "no" );
    fprintf( pAbc->Err, "\t-n       : toggle replacing gate/pin names by short strings [default = %s]\n", fShortNames? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle writing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle writing information about skipped gates [default = %s]\n", fVeryVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : prints the command summary\n" );
    fprintf( pAbc->Err, "\t<file>   : the name of a file to read\n" );
    return 1;
}